

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O3

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,FieldDescriptor *field,Options *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  uint uVar3;
  OneofDescriptor *pOVar4;
  ushort *puVar5;
  ushort *puVar6;
  FieldDescriptor *pFVar7;
  Options *pOVar8;
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  FieldDescriptor **ppFVar12;
  Nonnull<const_char_*> pcVar13;
  bool bVar14;
  byte v1;
  ulong uVar15;
  int line;
  FieldDescriptor *pFVar16;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  cpp *this;
  undefined1 cap_next_letter;
  AlphaNum *in_R8;
  _Optional_payload_base<int> in_R9;
  _Optional_payload_base<int> _Var17;
  long lVar18;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view input;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  string_view format_17;
  string accessor;
  Getters getters;
  string field_ptr;
  string result;
  string member;
  string default_field;
  string result_2;
  Getters getters_1;
  Call local_958;
  char *local_8f0;
  size_t local_8e8;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  char *local_8d0;
  size_t local_8c8;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  char *local_8b0;
  size_t local_8a8;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  EnumValueDescriptor *local_890;
  undefined8 local_888;
  undefined1 local_880 [16];
  undefined1 local_870 [24];
  char *local_858;
  _Optional_payload_base<int> local_850;
  undefined8 local_848;
  char *local_840;
  undefined1 local_838;
  undefined1 local_830 [32];
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_810;
  undefined8 local_808;
  DescriptorNames local_800;
  string *psStack_7f8;
  char local_7f0;
  undefined1 local_7e8 [24];
  EnumDescriptor *local_7d0;
  _Optional_payload_base<int> local_7c8;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_7c0;
  bool local_7b0;
  undefined1 local_7a8 [32];
  undefined1 local_788 [24];
  char *local_770;
  _Optional_payload_base<int> local_768;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_760;
  bool local_750;
  undefined1 local_748 [40];
  Call local_720;
  Options *local_6c0;
  string local_6b8;
  Call local_698;
  undefined1 local_638 [32];
  _Optional_payload_base<int> local_618;
  undefined8 local_610;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5d8 [96];
  Call local_578;
  Call local_518;
  Call local_4b8;
  Call local_458;
  Call local_3f8;
  Call local_398;
  Call local_338;
  Call local_2d8;
  Call local_278;
  Call local_210;
  Call local_1b0;
  Call local_150;
  Call local_f0;
  Call local_90;
  FieldDescriptor *extraout_RDX_03;
  
  local_8f0 = (char *)&local_8e0;
  local_8e0 = 0x6c6c756e;
  local_8e8 = 7;
  uStack_8dc = 0x727470;
  local_8d0 = (char *)&local_8c0;
  local_8c0 = 0x6c6c756e;
  local_8c8 = 7;
  uStack_8bc = 0x727470;
  local_8b0 = (char *)&local_8a0;
  local_8a0 = 0x6c6c756e;
  local_8a8 = 7;
  uStack_89c = 0x727470;
  bVar11 = field->field_0x1;
  bVar14 = (bool)((bVar11 & 0x20) >> 5);
  if (0xbf < bVar11 != bVar14) {
    pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar14,0xbf < bVar11,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_638)->_M_value,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar13);
LAB_002949eb:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_638)->_M_value);
  }
  if ((bVar11 & 0x20) == 0) {
    v1 = field->type_;
    uVar15 = (ulong)v1;
    uVar3 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + uVar15 * 4);
    pFVar16 = (FieldDescriptor *)(ulong)uVar3;
    if (uVar3 == 10) {
      if (v1 == 0xb) {
        bVar14 = FieldDescriptor::is_map_message_type(field);
        pFVar16 = extraout_RDX_05;
        if (bVar14) goto LAB_0029401c;
        bVar11 = field->field_0x1;
      }
      pFVar16 = (FieldDescriptor *)CONCAT71((int7)((ulong)pFVar16 >> 8),0xbf < bVar11);
      v1 = (bVar11 & 0x20) >> 5;
      if (0xbf < bVar11 != (bool)v1) {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            ((bool)v1,0xbf < bVar11,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)
                   &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_638)->_M_value,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar13);
        goto LAB_002949eb;
      }
      if ((((bVar11 & 0x20) != 0) ||
          (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10)) ||
         (((field->options_->field_0)._impl_.lazy_ == false &&
          ((field->options_->field_0)._impl_.unverified_lazy_ != true)))) goto LAB_0029401c;
LAB_00293bb2:
      bVar14 = ShouldSplit(field,opts);
      FieldMemberName_abi_cxx11_
                ((string *)(local_880 + 0x10),(cpp *)field,(FieldDescriptor *)(ulong)bVar14,(bool)v1
                );
      local_638._0_8_ =
           &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)local_638)->_M_value).field_2;
      local_638._16_4_ = 0x6c6c756e;
      local_638._8_8_ = 7;
      local_638._20_4_ = 0x727470;
      local_618 = (_Optional_payload_base<int>)&local_608;
      local_608 = 0x6c6c756e;
      local_610 = 7;
      uStack_604 = 0x727470;
      local_5f8 = (undefined1 *)&local_5e8;
      local_5e8 = 0x6c6c756e;
      local_5f0 = 7;
      uStack_5e4 = 0x727470;
      local_7e8._0_8_ = (EnumValueOptions *)0x1;
      local_7e8._8_8_ = "&";
      local_788._0_8_ = local_870._8_8_;
      local_788._8_8_ = local_870._0_8_;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_958,(lts_20250127 *)local_7e8,(AlphaNum *)local_788,
                 (AlphaNum *)local_870._8_8_);
      std::__cxx11::string::operator=
                ((string *)
                 &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_638)->_M_value,(string *)&local_958);
      if ((string_view *)local_958.var._M_len != &local_958.call) {
        operator_delete((void *)local_958.var._M_len,local_958.call._M_len + 1);
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        local_7e8._0_8_ = (EnumValueOptions *)0x1;
        local_7e8._8_8_ = "&";
        local_788._0_8_ = local_870._8_8_;
        local_788._8_8_ = local_870._0_8_;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_958,(lts_20250127 *)local_7e8,(AlphaNum *)local_788,
                   (AlphaNum *)local_870._8_8_);
        std::__cxx11::string::operator=((string *)&local_5f8,(string *)&local_958);
        if ((string_view *)local_958.var._M_len != &local_958.call) {
          operator_delete((void *)local_958.var._M_len,local_958.call._M_len + 1);
        }
      }
      if ((EnumDescriptor *)local_870._0_8_ != (EnumDescriptor *)(local_870 + 0x10)) {
        operator_delete((void *)local_870._0_8_,
                        (ulong)((long)&(((Message *)local_870._16_8_)->super_MessageLite).
                                       _vptr_MessageLite + 1));
      }
      std::__cxx11::string::operator=
                ((string *)&local_8f0,
                 (string *)
                 &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_638)->_M_value);
      std::__cxx11::string::operator=((string *)&local_8d0,(string *)&local_618);
LAB_00293fbc:
      std::__cxx11::string::operator=((string *)&local_8b0,(string *)&local_5f8);
      pFVar16 = extraout_RDX_06;
      if ((undefined4 *)local_5f8 != &local_5e8) {
        operator_delete(local_5f8,CONCAT44(uStack_5e4,local_5e8) + 1);
        pFVar16 = extraout_RDX_07;
      }
      if (local_618 != (_Optional_payload_base<int>)&local_608) {
        operator_delete((void *)local_618,CONCAT44(uStack_604,local_608) + 1);
        pFVar16 = extraout_RDX_08;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ ==
          &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              *)local_638)->_M_value).field_2) goto LAB_0029401c;
    }
    else {
      if (uVar3 != 9) goto LAB_00293bb2;
      if ((field->field_0x3 & 1) == 0) {
        bVar14 = ShouldSplit(field,opts);
        FieldMemberName_abi_cxx11_
                  ((string *)(local_880 + 0x10),(cpp *)field,(FieldDescriptor *)(ulong)bVar14,
                   SUB81(uVar15,0));
        local_638._0_8_ =
             &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *)local_638)->_M_value).field_2;
        local_638._16_4_ = 0x6c6c756e;
        local_638._8_8_ = 7;
        local_638._20_4_ = 0x727470;
        local_618 = (_Optional_payload_base<int>)&local_608;
        local_608 = 0x6c6c756e;
        local_610 = 7;
        uStack_604 = 0x727470;
        local_5f8 = (undefined1 *)&local_5e8;
        local_5e8 = 0x6c6c756e;
        local_5f0 = 7;
        uStack_5e4 = 0x727470;
        bVar14 = IsArenaStringPtr(field,opts);
        uVar10 = local_870._8_8_;
        uVar9 = local_870._0_8_;
        if ((bVar14) && (((field->field_20).default_value_enum_)->all_names_ != (string *)0x0)) {
          MakeDefaultFieldName_abi_cxx11_((string *)&local_958,(cpp *)field,field_00);
          local_788._8_8_ = (EnumDescriptor *)0x0;
          local_788._16_8_ = local_788._16_8_ & 0xffffffffffffff00;
          local_7e8._0_8_ = uVar10;
          local_7e8._8_8_ = uVar9;
          local_7e8._16_8_ = local_958.var._M_str;
          local_7d0 = (EnumDescriptor *)local_958.var._M_len;
          format_04._M_str = local_7e8;
          format_04._M_len = (size_t)"$0.IsDefault() ? &$1.get() : $0.UnsafeGetPointer()";
          local_788._0_8_ = (AlphaNum *)(local_788 + 0x10);
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)local_788,(Nonnull<std::string_*>)0x32,format_04,
                     (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
          std::__cxx11::string::operator=
                    ((string *)
                     &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_638)->_M_value,(string *)local_788);
          if ((AlphaNum *)local_788._0_8_ != (AlphaNum *)(local_788 + 0x10)) {
            operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
          }
        }
        else {
          local_7e8._0_8_ = (EnumValueOptions *)0x1;
          local_7e8._8_8_ = "&";
          local_788._0_8_ = local_870._8_8_;
          local_788._8_8_ = local_870._0_8_;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)&local_958,(lts_20250127 *)local_7e8,(AlphaNum *)local_788,
                     (AlphaNum *)local_870._8_8_);
          std::__cxx11::string::operator=
                    ((string *)
                     &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_638)->_M_value,(string *)&local_958);
        }
        if ((string_view *)local_958.var._M_len != &local_958.call) {
          operator_delete((void *)local_958.var._M_len,local_958.call._M_len + 1);
        }
        std::__cxx11::string::_M_assign((string *)&local_5f8);
        if ((EnumDescriptor *)local_870._0_8_ != (EnumDescriptor *)(local_870 + 0x10)) {
          operator_delete((void *)local_870._0_8_,
                          (ulong)((long)&(((Message *)local_870._16_8_)->super_MessageLite).
                                         _vptr_MessageLite + 1));
        }
        std::__cxx11::string::operator=
                  ((string *)&local_8f0,
                   (string *)
                   &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_638)->_M_value);
        std::__cxx11::string::operator=((string *)&local_8d0,(string *)&local_618);
        goto LAB_00293fbc;
      }
      if ((bVar11 & 0x10) == 0) {
        line = 0xb63;
LAB_00294a5b:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,line);
      }
      pOVar4 = (field->scope_).containing_oneof;
      if (pOVar4 == (OneofDescriptor *)0x0) {
        line = 0xb31;
        goto LAB_00294a5b;
      }
      if ((pOVar4->field_count_ == 1) && ((pOVar4->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)
                   &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_638)->_M_value,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        goto LAB_002949eb;
      }
      bVar14 = ShouldSplit(field,opts);
      cap_next_letter = SUB81(in_R8,0);
      FieldMemberName_abi_cxx11_
                ((string *)local_788,(cpp *)field,(FieldDescriptor *)(ulong)bVar14,SUB81(uVar15,0));
      local_870._0_8_ = local_870 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_880 + 0x10),local_788._0_8_,
                 (char *)(local_788._0_8_ + local_788._8_8_));
      bVar14 = IsArenaStringPtr(field,opts);
      if (bVar14) {
        local_7e8._8_8_ = (EnumDescriptor *)0x0;
        local_7e8._16_8_ = local_7e8._16_8_ & 0xffffffffffffff00;
        local_958.var._M_len = local_788._8_8_;
        local_958.var._M_str = (char *)local_788._0_8_;
        cap_next_letter = 1;
        format_01._M_str = (char *)&local_958;
        format_01._M_len = (size_t)"$0.UnsafeGetPointer()";
        local_7e8._0_8_ = (EnumValueOptions *)(local_7e8 + 0x10);
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)local_7e8,(Nonnull<std::string_*>)0x15,format_01,
                   (Nullable<const_absl::string_view_*>)0x1,(size_t)in_R9);
        std::__cxx11::string::operator=((string *)(local_880 + 0x10),(string *)local_7e8);
        if ((EnumValueOptions *)local_7e8._0_8_ != (EnumValueOptions *)(local_7e8 + 0x10)) {
          operator_delete((void *)local_7e8._0_8_,
                          (ulong)((long)&((string_view *)local_7e8._16_8_)->_M_len + 1));
        }
      }
      puVar5 = (ushort *)(pOVar4->all_names_).payload_;
      uVar15 = (ulong)*puVar5;
      puVar6 = (ushort *)(field->all_names_).payload_;
      this = (cpp *)(ulong)*puVar6;
      input._M_len = (long)puVar6 + ~(ulong)this;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_((string *)&local_720,this,input,(bool)cap_next_letter);
      local_7e8._8_8_ = (long)puVar5 + ~uVar15;
      local_958.var._M_len = (size_t)&local_958.call;
      local_958.var._M_str = (char *)0x0;
      local_958.call._M_len = local_958.call._M_len & 0xffffffffffffff00;
      local_7e8._16_8_ = local_720.var._M_str;
      local_7d0 = (EnumDescriptor *)local_720.var._M_len;
      format_02._M_str = local_7e8;
      format_02._M_len = (size_t)"$0_case() == k$1";
      local_7e8._0_8_ = uVar15;
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_958,(Nonnull<std::string_*>)0x10,format_02,
                 (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
      pFVar16 = extraout_RDX_03;
      if ((string_view *)local_720.var._M_len != &local_720.call) {
        operator_delete((void *)local_720.var._M_len,local_720.call._M_len + 1);
        pFVar16 = extraout_RDX_04;
      }
      MakeDefaultFieldName_abi_cxx11_((string *)&local_720,(cpp *)field,pFVar16);
      bVar14 = IsArenaStringPtr(field,opts);
      if (bVar14) {
        local_7e8._0_8_ = &DAT_00000006;
        local_7e8._8_8_ = ".get()";
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)&local_720,(AlphaNum *)local_7e8);
      }
      local_638._0_8_ =
           &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)local_638)->_M_value).field_2;
      local_638._16_4_ = 0x6c6c756e;
      local_638._8_8_ = 7;
      local_638._20_4_ = 0x727470;
      local_608 = 0x6c6c756e;
      local_610 = 7;
      uStack_604 = 0x727470;
      local_5e8 = 0x6c6c756e;
      local_5f0 = 7;
      uStack_5e4 = 0x727470;
      local_618 = (_Optional_payload_base<int>)&local_608;
      local_5f8 = (undefined1 *)&local_5e8;
      if (((field->field_20).default_value_enum_)->all_names_ == (string *)0x0) {
        local_698.var._M_len = (size_t)&local_698.call;
        local_698.var._M_str = (char *)0x0;
        local_698.call._M_len = (ulong)local_698.call._M_len._1_7_ << 8;
        local_7e8._0_8_ = local_958.var._M_str;
        local_7e8._8_8_ = local_958.var._M_len;
        local_7e8._16_8_ = local_870._8_8_;
        local_7d0 = (EnumDescriptor *)local_870._0_8_;
        format_17._M_str = local_7e8;
        format_17._M_len = (size_t)"$0 ? $1 : nullptr";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_698,(Nonnull<std::string_*>)0x11,format_17,
                   (Nullable<const_absl::string_view_*>)0x2,(size_t)in_R9);
      }
      else {
        local_698.var._M_len = (size_t)&local_698.call;
        local_698.var._M_str = (char *)0x0;
        local_698.call._M_len = (ulong)local_698.call._M_len._1_7_ << 8;
        local_7e8._0_8_ = local_958.var._M_str;
        local_7e8._8_8_ = local_958.var._M_len;
        local_7e8._16_8_ = local_870._8_8_;
        local_7d0 = (EnumDescriptor *)local_870._0_8_;
        local_7c8 = (_Optional_payload_base<int>)local_720.var._M_str;
        local_7c0._M_value._M_len = local_720.var._M_len;
        format_03._M_str = local_7e8;
        format_03._M_len = (size_t)"$0 ? $1 : &$2";
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_698,(Nonnull<std::string_*>)&DAT_0000000d,format_03
                   ,(Nullable<const_absl::string_view_*>)0x3,(size_t)local_720.var._M_str);
        in_R9 = (_Optional_payload_base<int>)local_720.var._M_str;
      }
      std::__cxx11::string::operator=
                ((string *)
                 &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_638)->_M_value,(string *)&local_698);
      if ((string_view *)local_698.var._M_len != &local_698.call) {
        operator_delete((void *)local_698.var._M_len,local_698.call._M_len + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_5f8);
      if ((string_view *)local_720.var._M_len != &local_720.call) {
        operator_delete((void *)local_720.var._M_len,local_720.call._M_len + 1);
      }
      if ((string_view *)local_958.var._M_len != &local_958.call) {
        operator_delete((void *)local_958.var._M_len,local_958.call._M_len + 1);
      }
      if ((EnumDescriptor *)local_870._0_8_ != (EnumDescriptor *)(local_870 + 0x10)) {
        operator_delete((void *)local_870._0_8_,
                        (ulong)((long)&(((Message *)local_870._16_8_)->super_MessageLite).
                                       _vptr_MessageLite + 1));
      }
      if ((AlphaNum *)local_788._0_8_ != (AlphaNum *)(local_788 + 0x10)) {
        operator_delete((void *)local_788._0_8_,local_788._16_8_ + 1);
      }
      std::__cxx11::string::operator=
                ((string *)&local_8f0,
                 (string *)
                 &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_638)->_M_value);
      std::__cxx11::string::operator=((string *)&local_8d0,(string *)&local_618);
      std::__cxx11::string::operator=((string *)&local_8b0,(string *)&local_5f8);
      pFVar16 = extraout_RDX_10;
      if ((undefined4 *)local_5f8 != &local_5e8) {
        operator_delete(local_5f8,CONCAT44(uStack_5e4,local_5e8) + 1);
        pFVar16 = extraout_RDX_11;
      }
      if (local_618 != (_Optional_payload_base<int>)&local_608) {
        operator_delete((void *)local_618,CONCAT44(uStack_604,local_608) + 1);
        pFVar16 = extraout_RDX_12;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_638._0_8_ ==
          &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              *)local_638)->_M_value).field_2) goto LAB_0029401c;
    }
  }
  else {
    paVar1 = &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 *)local_638)->_M_value).field_2;
    local_638._16_4_ = 0x6c6c756e;
    pFVar16 = (FieldDescriptor *)0x7;
    local_638._8_8_ = 7;
    local_638._20_4_ = 0x727470;
    local_608 = 0x6c6c756e;
    local_610 = 7;
    uStack_604 = 0x727470;
    local_5e8 = 0x6c6c756e;
    local_5f0 = 7;
    uStack_5e4 = 0x727470;
    bVar11 = field->type_;
    local_638._0_8_ = paVar1;
    local_618 = (_Optional_payload_base<int>)&local_608;
    local_5f8 = (undefined1 *)&local_5e8;
    if (bVar11 == 0xb) {
      bVar14 = FieldDescriptor::is_map_message_type(field);
      if (!bVar14) {
        bVar11 = field->type_;
        pFVar16 = extraout_RDX;
        goto LAB_0029355d;
      }
    }
    else {
LAB_0029355d:
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar11 * 4) != 10) {
        local_7e8._0_8_ = 10;
        local_7e8._8_8_ = "_internal_";
        FieldName_abi_cxx11_((string *)&local_720,(cpp *)field,pFVar16);
        local_788._0_8_ = local_720.var._M_str;
        local_788._8_8_ = local_720.var._M_len;
        local_870._0_8_ = (EnumDescriptor *)0x2;
        local_870._8_8_ = "()";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_958,(lts_20250127 *)local_7e8,(AlphaNum *)local_788,
                   (AlphaNum *)(local_880 + 0x10),in_R8);
        if ((string_view *)local_720.var._M_len != &local_720.call) {
          operator_delete((void *)local_720.var._M_len,local_720.call._M_len + 1);
        }
        puVar2 = local_7e8 + 0x10;
        local_7e8._8_8_ = (char *)0x0;
        local_7e8._16_8_ = local_7e8._16_8_ & 0xffffffffffffff00;
        local_788._0_8_ = local_958.var._M_str;
        local_788._8_8_ = local_958.var._M_len;
        format._M_str = local_788;
        format._M_len = (size_t)"&$0.Get(index)";
        local_7e8._0_8_ = puVar2;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)local_7e8,(Nonnull<std::string_*>)0xe,format,
                   (Nullable<const_absl::string_view_*>)0x1,(size_t)in_R9);
        std::__cxx11::string::operator=
                  ((string *)
                   &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)local_638)->_M_value,(string *)local_7e8);
        if ((undefined1 *)local_7e8._0_8_ != puVar2) {
          operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
        }
        local_7e8._8_8_ = (char *)0x0;
        local_7e8._16_8_ = local_7e8._16_8_ & 0xffffffffffffff00;
        local_788._0_8_ = local_958.var._M_str;
        local_788._8_8_ = local_958.var._M_len;
        format_00._M_str = local_788;
        format_00._M_len = (size_t)"&$0.Get($0.size() - 1)";
        local_7e8._0_8_ = puVar2;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)local_7e8,(Nonnull<std::string_*>)0x16,format_00,
                   (Nullable<const_absl::string_view_*>)0x1,(size_t)in_R9);
        std::__cxx11::string::operator=((string *)&local_618,(string *)local_7e8);
        if ((undefined1 *)local_7e8._0_8_ != puVar2) {
          operator_delete((void *)local_7e8._0_8_,
                          (ulong)((long)&((string_view *)local_7e8._16_8_)->_M_len + 1));
        }
        local_7e8._0_8_ = (EnumValueOptions *)0x1;
        local_7e8._8_8_ = "&";
        local_788._0_8_ = local_958.var._M_str;
        local_788._8_8_ = local_958.var._M_len;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)(local_880 + 0x10),(lts_20250127 *)local_7e8,(AlphaNum *)local_788,
                   (AlphaNum *)local_958.var._M_str);
        std::__cxx11::string::operator=((string *)&local_5f8,(string *)(local_880 + 0x10));
        if ((EnumDescriptor *)local_870._0_8_ != (EnumDescriptor *)(local_870 + 0x10)) {
          operator_delete((void *)local_870._0_8_,
                          (ulong)((long)&(((Message *)local_870._16_8_)->super_MessageLite).
                                         _vptr_MessageLite + 1));
        }
        if ((string_view *)local_958.var._M_len != &local_958.call) {
          operator_delete((void *)local_958.var._M_len,local_958.call._M_len + 1);
        }
      }
    }
    std::__cxx11::string::operator=
              ((string *)&local_8f0,
               (string *)
               &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  *)local_638)->_M_value);
    std::__cxx11::string::operator=((string *)&local_8d0,(string *)&local_618);
    std::__cxx11::string::operator=((string *)&local_8b0,(string *)&local_5f8);
    pFVar16 = extraout_RDX_00;
    if ((undefined4 *)local_5f8 != &local_5e8) {
      operator_delete(local_5f8,CONCAT44(uStack_5e4,local_5e8) + 1);
      pFVar16 = extraout_RDX_01;
    }
    if (local_618 != (_Optional_payload_base<int>)&local_608) {
      operator_delete((void *)local_618,CONCAT44(uStack_604,local_608) + 1);
      pFVar16 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._0_8_ == paVar1) goto LAB_0029401c;
  }
  operator_delete((void *)local_638._0_8_,CONCAT44(local_638._20_4_,local_638._16_4_) + 1);
  pFVar16 = extraout_RDX_09;
LAB_0029401c:
  if ((field->field_0x1 & 8) == 0) {
    ppFVar12 = &field->containing_type_->fields_;
  }
  else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
    ppFVar12 = &field->file_->extensions_;
  }
  else {
    ppFVar12 = &((field->scope_).extension_scope)->extensions_;
  }
  pFVar7 = *ppFVar12;
  pOVar8 = (Options *)field->containing_type_;
  FieldName_abi_cxx11_(&local_6b8,(cpp *)field,pFVar16);
  local_888 = 0;
  local_880[0] = (SymbolBase)'\0';
  local_638._0_8_ = local_6b8._M_string_length;
  local_638._8_8_ = local_6b8._M_dataplus._M_p;
  format_05._M_str = (char *)local_638;
  format_05._M_len = (size_t)"$0_AccessedNoStrip = true;";
  local_890 = (EnumValueDescriptor *)local_880;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_890,(Nonnull<std::string_*>)0x1a,format_05,
             (Nullable<const_absl::string_view_*>)0x1,(size_t)in_R9);
  local_810.default_value_enum_ = (EnumValueDescriptor *)&local_800;
  if (local_890 == (EnumValueDescriptor *)local_880) {
    psStack_7f8 = (string *)local_880._8_8_;
  }
  else {
    local_810.default_value_enum_ = local_890;
  }
  local_800.payload_._1_7_ = local_880._1_7_;
  local_800.payload_._0_1_ = local_880[0];
  local_808 = local_888;
  local_888 = 0;
  local_880[0] = (SymbolBase)'\0';
  local_7f0 = '\x01';
  _Var17 = (_Optional_payload_base<int>)
           ((ulong)(uint)((int)((long)field - (long)pFVar7 >> 3) * -0x45d1745d) | 0x100000000);
  local_7e8._0_8_ = 3;
  local_7e8._8_8_ = "get";
  local_7e8._16_8_ = &DAT_00000005;
  local_7d0 = (EnumDescriptor *)0x5baf06;
  local_7c0._M_value._M_len = 4;
  local_7c0._M_value._M_str = "this";
  local_7b0 = true;
  local_7a8._0_8_ = (pointer)0x0;
  local_7a8[8] = 0;
  local_7a8._9_7_ = 0;
  local_7a8[0x10] = 0;
  local_7a8._17_8_ = 0;
  format_06._M_str = local_8f0;
  format_06._M_len = local_8e8;
  local_890 = (EnumValueDescriptor *)local_880;
  local_7c8 = _Var17;
  anon_unknown_0::Call::Arg<>
            ((Call *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_638)->_M_value,(Call *)local_7e8,format_06);
  local_788._0_8_ = (pointer)0x3;
  local_788._8_8_ = "set";
  local_788._16_8_ = 5;
  local_770 = "OnSet";
  local_760._M_value._M_len = 4;
  local_760._M_value._M_str = "this";
  local_750 = true;
  local_748._0_8_ = (pointer)0x0;
  local_748[8] = 0;
  local_748._9_7_ = 0;
  local_748[0x10] = 0;
  local_748._17_8_ = 0;
  format_07._M_str = local_8f0;
  format_07._M_len = local_8e8;
  local_768 = _Var17;
  anon_unknown_0::Call::Arg<>((Call *)local_5d8,(Call *)local_788,format_07);
  local_870._0_8_ = (EnumDescriptor *)0x3;
  local_870._8_8_ = "has";
  local_870._16_8_ = (FeatureSet *)0x5;
  local_858 = "OnHas";
  local_848 = 4;
  local_840 = "this";
  local_838 = 1;
  local_830._0_8_ = 0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  local_830[0x10] = 0;
  local_830._17_8_ = 0;
  format_08._M_str = local_8f0;
  format_08._M_len = local_8e8;
  local_850 = _Var17;
  anon_unknown_0::Call::Arg<>(&local_578,(Call *)(local_880 + 0x10),format_08);
  local_958.var._M_len = 7;
  local_958.var._M_str = "mutable";
  local_958.call._M_len = 9;
  local_958.call._M_str = "OnMutable";
  local_958.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_958.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_958.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_958.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_958.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_958.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_958.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_958._81_8_ = 0;
  format_09._M_str = local_8f0;
  format_09._M_len = local_8e8;
  local_958.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_518,&local_958,format_09);
  local_720.var._M_len = 7;
  local_720.var._M_str = "release";
  local_720.call._M_len = 9;
  local_720.call._M_str = "OnRelease";
  local_720.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_720.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_720.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_720.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_720.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_720.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_720.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_720._81_8_ = 0;
  format_10._M_str = local_8f0;
  format_10._M_len = local_8e8;
  local_720.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_4b8,&local_720,format_10);
  local_698.var._M_len = 5;
  local_698.var._M_str = "clear";
  local_698.call._M_len = 7;
  local_698.call._M_str = "OnClear";
  local_698.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_698.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_698.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_698.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_698.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_698.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_698.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_698._81_8_ = 0;
  format_11._M_str = local_8b0;
  format_11._M_len = local_8a8;
  local_698.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_458,&local_698,format_11);
  local_210.var._M_len = 4;
  local_210.var._M_str = "size";
  local_210.call._M_len = 6;
  local_210.call._M_str = "OnSize";
  local_210.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_210.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_210.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_210.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_210.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_210.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_210.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_210._81_8_ = 0;
  format_12._M_str = local_8b0;
  format_12._M_len = local_8a8;
  local_210.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_3f8,&local_210,format_12);
  local_90.var._M_len = 4;
  local_90.var._M_str = "list";
  local_90.call._M_len = 6;
  local_90.call._M_str = "OnList";
  local_90.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_90.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_90.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_90.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_90.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_90.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_90._81_8_ = 0;
  format_13._M_str = local_8b0;
  format_13._M_len = local_8a8;
  local_90.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_398,&local_90,format_13);
  local_f0.var._M_len = 0xc;
  local_f0.var._M_str = "mutable_list";
  local_f0.call._M_len = 0xd;
  local_f0.call._M_str = "OnMutableList";
  local_f0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_f0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_f0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_f0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._81_8_ = 0;
  format_14._M_str = local_8b0;
  format_14._M_len = local_8a8;
  local_6c0 = pOVar8;
  local_f0.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_338,&local_f0,format_14);
  local_150.var._M_len = 3;
  local_150.var._M_str = "add";
  local_150.call._M_len = 5;
  local_150.call._M_str = "OnAdd";
  local_150.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_150.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_150.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_150.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_150.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_150.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_150._81_8_ = 0;
  format_15._M_str = local_8d0;
  format_15._M_len = local_8c8;
  local_150.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_2d8,&local_150,format_15);
  local_1b0.var._M_len = 0xb;
  local_1b0.var._M_str = "add_mutable";
  local_1b0.call._M_len = 0xc;
  local_1b0.call._M_str = "OnAddMutable";
  local_1b0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = 4;
  local_1b0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = "this";
  local_1b0.thiz.
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_engaged =
       true;
  local_1b0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_1b0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1b0.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_1b0._81_8_ = 0;
  format_16._M_str = local_8d0;
  format_16._M_len = local_8c8;
  local_1b0.field_index.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_Var17;
  anon_unknown_0::Call::Arg<>(&local_278,&local_1b0,format_16);
  calls.len_ = (size_type)opts;
  calls.ptr_ = (pointer)__return_storage_ptr__;
  anon_unknown_0::GenerateTrackerCalls
            (__return_storage_ptr__,(anon_unknown_0 *)opts,local_6c0,
             (Descriptor *)&local_810.default_generated_instance_,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   *)local_638)->_M_value,calls);
  lVar18 = 0x400;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)local_638 + lVar18));
    lVar18 = lVar18 + -0x60;
  } while (lVar18 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_698.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_720.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_958.args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_870 + 0x40));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_748);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_7a8);
  if ((local_7f0 == '\x01') && (local_7f0 = '\0', local_810 != &local_800)) {
    operator_delete(local_810.default_value_enum_,(ulong)(local_800.payload_ + 1));
  }
  if (local_890 != (EnumValueDescriptor *)local_880) {
    operator_delete(local_890,CONCAT71(local_880._1_7_,local_880[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if (local_8b0 != (char *)&local_8a0) {
    operator_delete(local_8b0,CONCAT44(uStack_89c,local_8a0) + 1);
  }
  if (local_8d0 != (char *)&local_8c0) {
    operator_delete(local_8d0,CONCAT44(uStack_8bc,local_8c0) + 1);
  }
  if (local_8f0 != (char *)&local_8e0) {
    operator_delete(local_8f0,CONCAT44(uStack_8dc,local_8e0) + 1);
  }
  return (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
          *)(pointer)__return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const FieldDescriptor* field,
                                  const Options& opts) {
  Getters getters;
  if (field->is_repeated()) {
    getters = RepeatedFieldGetters(field, opts);
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    const auto* oneof = field->real_containing_oneof();
    if (oneof != nullptr) {
      getters = StringOneofGetters(field, oneof, opts);
    } else {
      getters = StringFieldGetters(field, opts);
    }
  } else if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE ||
             IsExplicitLazy(field)) {
    getters = SingularFieldGetters(field, opts);
  }

  auto index = field->index();
  return GenerateTrackerCalls(
      opts, field->containing_type(),
      absl::Substitute("$0_AccessedNoStrip = true;", FieldName(field)),
      {
          Call(index, "get", "OnGet").Arg(getters.base),
          Call(index, "set", "OnSet").Arg(getters.base),
          Call(index, "has", "OnHas").Arg(getters.base),
          Call(index, "mutable", "OnMutable").Arg(getters.base),
          Call(index, "release", "OnRelease").Arg(getters.base),
          Call(index, "clear", "OnClear").Arg(getters.for_flat),
          Call(index, "size", "OnSize").Arg(getters.for_flat),
          Call(index, "list", "OnList").Arg(getters.for_flat),
          Call(index, "mutable_list", "OnMutableList").Arg(getters.for_flat),
          Call(index, "add", "OnAdd").Arg(getters.for_last),
          Call(index, "add_mutable", "OnAddMutable").Arg(getters.for_last),
      });
}